

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

string * tToDate_abi_cxx11_(string *__return_storage_ptr__,int32_t t_s)

{
  tm *__tp;
  size_t sVar1;
  time_t t;
  char buf [256];
  long local_120;
  char local_118 [264];
  
  local_120 = (long)t_s;
  __tp = localtime(&local_120);
  strftime(local_118,0x100,"%A, %B %d",__tp);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar1 = strlen(local_118);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_118,local_118 + sVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string tToDate(int32_t t_s) {
    char buf[256];
    time_t t = t_s;
    struct tm *tm = localtime(&t);
    strftime(buf, sizeof(buf), "%A, %B %d", tm);
    return buf;
}